

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O3

double __thiscall spatial_region::tilde_w(spatial_region *this,double *g,double *r,double *chi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  dVar1 = *chi;
  dVar5 = 0.0;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return dVar5;
  }
  dVar6 = *r;
  if ((1.0 <= dVar6 * *g) && (1.0 <= (1.0 - dVar6) * *g)) {
    dVar6 = 1.0 / (dVar1 * dVar6 * (1.0 - dVar6));
    dVar7 = pow(dVar6,0.3333333333333333);
    dVar4 = dVar7 * dVar7;
    dVar1 = this->e_s;
    dVar5 = *g;
    dVar8 = exp((dVar6 * -2.0) / 3.0);
    dVar6 = dVar4 + 0.80049;
    dVar6 = dVar6 * dVar6 * dVar6;
    if (dVar6 < 0.0) {
      auVar11._0_8_ = sqrt(dVar6);
      auVar11._8_56_ = extraout_var;
      auVar9 = auVar11._0_16_;
    }
    else {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar6;
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
    }
    if (auVar9._0_8_ < 0.0) {
      dVar6 = sqrt(auVar9._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar6 = auVar9._0_8_;
    }
    dVar2 = *r;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar4;
    dVar3 = *chi;
    auVar9 = vfmadd213sd_fma(auVar16,auVar16,ZEXT816(0x3ff0000000000000));
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (dVar4 * -0.65) / auVar9._0_8_ + 1.0;
    auVar9 = vfmadd132sd_fma(auVar10,auVar16,ZEXT816(0x3fe6aceee0f3cb3e));
    if (auVar9._0_8_ < 0.0) {
      auVar12._0_8_ = sqrt(auVar9._0_8_);
      auVar12._8_56_ = extraout_var_00;
      auVar9 = auVar12._0_16_;
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
    }
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar2 + dVar2;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = 1.0 - dVar2;
    auVar15._0_8_ = 1.0 / dVar6;
    auVar10 = vfmadd213sd_fma(auVar17,auVar18,ZEXT816(0xbff0000000000000));
    if (auVar9._0_8_ < 0.0) {
      auVar13._0_8_ = sqrt(auVar9._0_8_);
      auVar13._8_56_ = extraout_var_01;
      auVar9 = auVar13._0_16_;
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
    }
    auVar15._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar10._0_8_ * dVar3 * dVar7;
    auVar9 = vfnmadd213sd_fma(auVar14,auVar9,auVar15);
    dVar5 = ((dVar1 * 0.0020591) / (dVar5 * dVar5)) * dVar8 * auVar9._0_8_;
  }
  return dVar5;
}

Assistant:

double spatial_region::tilde_w(double& g, double& r, double& chi)
{ // \int_0^g w \, dg = W, время нормировано на c/\omega
    /* Используются следующие аппроксимации: Ai'(x) \approx -exp(
     * -2/3*x^(3/2) )/(2*sqrt(pi)) * ( x + 0.70861*(1-0.65*x/(1+x^2))
     * )^(1/4); \int_x^\infty Ai(y) dy \approx exp( -2/3*x^(3/2)
     * )/(sqrt(2*pi))/( x + 0.80049 )^(3/4) */
    if (chi==0||r*g<1||(1-r)*g<1)
    {
        return 0;
    }
    else
    {
        double a;
        double d;
        double kappa;
        d = 1/(r*(1-r)*chi);
        a = pow(d,(double)1/3);
        kappa = a*a;
        // 1/( 137*2*sqrt(pi) ) = 0.0020591
        return 0.0020591*e_s/(g*g)*exp(-2*d/3)*(1/sqrt(sqrt((kappa+0.80049)*(kappa+0.80049)*(kappa+0.80049))) - (2*r*(1-r)-1)*chi*a*sqrt(sqrt(kappa+0.70861*(1-0.65*kappa/(1+kappa*kappa)))));
    }
}